

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

vector<uint256,_std::allocator<uint256>_> * __thiscall
CCoinsViewDB::GetHeadBlocks(CCoinsViewDB *this)

{
  long lVar1;
  bool bVar2;
  vector<uint256,_std::allocator<uint256>_> *in_RSI;
  vector<uint256,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> vhashHeadBlocks;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffff88;
  vector<uint256,_std::allocator<uint256>_> *this_00;
  vector<uint256,_std::allocator<uint256>_> *key;
  CDBWrapper *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  key = in_RDI;
  std::vector<uint256,_std::allocator<uint256>_>::vector(in_stack_ffffffffffffff88);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_ffffffffffffff88);
  bVar2 = CDBWrapper::Read<unsigned_char,std::vector<uint256,std::allocator<uint256>>>
                    (in_stack_ffffffffffffffe0,(uchar *)key,in_RSI);
  if (bVar2) {
    std::vector<uint256,_std::allocator<uint256>_>::vector
              (in_stack_ffffffffffffff88,(vector<uint256,_std::allocator<uint256>_> *)0x141c0ba);
  }
  else {
    memset(this_00,0,0x18);
    std::vector<uint256,_std::allocator<uint256>_>::vector(in_stack_ffffffffffffff88);
  }
  std::vector<uint256,_std::allocator<uint256>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<uint256> CCoinsViewDB::GetHeadBlocks() const {
    std::vector<uint256> vhashHeadBlocks;
    if (!m_db->Read(DB_HEAD_BLOCKS, vhashHeadBlocks)) {
        return std::vector<uint256>();
    }
    return vhashHeadBlocks;
}